

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_184af4d::HandleStripCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  ulong uVar2;
  pointer pcVar3;
  cmMakefile *this;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  string_view value;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  long local_48;
  pointer local_40;
  cmExecutionStatus *local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar6 == 0x60) {
    local_40 = pbVar1 + 1;
    uVar2 = pbVar1[1]._M_string_length;
    uVar7 = uVar2 + 1;
    local_48 = lVar6;
    local_38 = status;
    if (uVar2 != 0) {
      pcVar3 = (local_40->_M_dataplus)._M_p;
      uVar8 = 0;
      do {
        iVar4 = isspace((uint)(byte)pcVar3[uVar8]);
        uVar5 = uVar8;
        if (uVar7 <= uVar2) {
          uVar5 = uVar7;
        }
        if (iVar4 == 0) {
          uVar7 = uVar5;
        }
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
    this = local_38->Makefile;
    std::__cxx11::string::substr((ulong)&local_68,(ulong)local_40);
    value._M_str = (char *)local_68;
    value._M_len = local_60;
    cmMakefile::AddDefinition(this,pbVar1 + 2,value);
    lVar6 = local_48;
    if (local_68 == local_58) goto LAB_00433a3d;
  }
  else {
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"sub-command STRIP requires two arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_68 == local_58) goto LAB_00433a3d;
  }
  operator_delete(local_68,local_58[0] + 1);
LAB_00433a3d:
  return lVar6 == 0x60;
}

Assistant:

bool HandleStripCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("sub-command STRIP requires two arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  const std::string& variableName = args[2];
  size_t inStringLength = stringValue.size();
  size_t startPos = inStringLength + 1;
  size_t endPos = 0;
  const char* ptr = stringValue.c_str();
  size_t cc;
  for (cc = 0; cc < inStringLength; ++cc) {
    if (!cmIsSpace(*ptr)) {
      if (startPos > inStringLength) {
        startPos = cc;
      }
      endPos = cc;
    }
    ++ptr;
  }

  size_t outLength = 0;

  // if the input string didn't contain any non-space characters, return
  // an empty string
  if (startPos > inStringLength) {
    outLength = 0;
    startPos = 0;
  } else {
    outLength = endPos - startPos + 1;
  }

  status.GetMakefile().AddDefinition(variableName,
                                     stringValue.substr(startPos, outLength));
  return true;
}